

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldConvertors.h
# Opt level: O2

bool FIX::DoubleConvertor::convert(string *value,double *result)

{
  char *pcVar1;
  char *pcVar2;
  char cVar3;
  bool bVar4;
  bool bVar5;
  double dVar6;
  int processed_chars;
  int local_c;
  
  pcVar1 = (value->_M_dataplus)._M_p;
  cVar3 = *pcVar1;
  if (cVar3 == '\0') {
LAB_001a8a95:
    bVar5 = false;
  }
  else {
    pcVar2 = pcVar1;
    if (cVar3 == '-') {
      cVar3 = pcVar1[1];
      if (cVar3 == '\0') goto LAB_001a8a95;
      pcVar2 = pcVar1 + 1;
    }
    bVar4 = (int)cVar3 - 0x30U < 10;
    bVar5 = bVar4;
    while (bVar5) {
      cVar3 = pcVar2[1];
      pcVar2 = pcVar2 + 1;
      bVar5 = (int)cVar3 - 0x30U < 10;
    }
    if ((cVar3 == '.') && (cVar3 = pcVar2[1], (int)cVar3 - 0x30U < 10)) {
      pcVar2 = pcVar2 + 2;
      do {
        cVar3 = *pcVar2;
        pcVar2 = pcVar2 + 1;
      } while ((int)cVar3 - 0x30U < 10);
      bVar4 = true;
    }
    bVar5 = false;
    if ((cVar3 == '\0') && (bVar5 = false, bVar4)) {
      dVar6 = (double)FIX::DoubleConvertor::fast_strtod
                                (pcVar1,(int)value->_M_string_length,&local_c);
      *result = dVar6;
      bVar5 = true;
    }
  }
  return bVar5;
}

Assistant:

static bool convert(const std::string &value, double &result) {
    const char *i = value.c_str();

    // Catch null strings
    if (!*i) {
      return false;
    }
    // Eat leading '-' and recheck for null string
    if (*i == '-' && !*++i) {
      return false;
    }

    bool haveDigit = false;

    if (IS_DIGIT(*i)) {
      haveDigit = true;
      while (IS_DIGIT(*++i))
        ;
    }

    if (*i == '.' && IS_DIGIT(*++i)) {
      haveDigit = true;
      while (IS_DIGIT(*++i))
        ;
    }

    if (*i || !haveDigit) {
      return false;
    }

    int processed_chars;
    const size_t total_length = value.length();
    result = fast_strtod(value.c_str(), static_cast<int>(total_length), &processed_chars);

    return true;
  }